

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O0

ssize_t __thiscall QIODevice::read(QIODevice *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  bool bVar2;
  QFlags<QIODeviceBase::OpenModeFlag> QVar3;
  int iVar4;
  QIODevicePrivate *this_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  qint64 readBytes;
  char c;
  int chint;
  bool sequential;
  QIODevicePrivate *d;
  undefined8 in_stack_ffffffffffffff78;
  OpenModeFlag in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint uVar5;
  ssize_t local_20;
  QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4> local_14;
  Int local_10;
  CompareAgainstLiteralZero local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QIODevice *)0x1307ba);
  QVar3 = QFlags<QIODeviceBase::OpenModeFlag>::operator&
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (OpenModeFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20));
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_9,0);
  bVar1 = ::operator==(QVar3.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                       super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
  if (bVar1) {
    local_10 = (this_00->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i;
    bVar1 = ::operator==((QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>)
                         SUB84((ulong)this >> 0x20,0),in_stack_ffffffffffffff80);
    if (bVar1) {
      checkWarnMessage(this,"read","device not open");
      local_20 = -1;
    }
    else {
      checkWarnMessage(this,"read","WriteOnly device");
      local_20 = -1;
    }
  }
  else {
    bVar1 = QIODevicePrivate::isSequential
                      ((QIODevicePrivate *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    if ((__buf != (void *)0x1) || ((bVar1 && ((this_00->transactionStarted & 1U) != 0)))) {
LAB_00130978:
      if ((long)__buf < 0) {
        checkWarnMessage(this,"read","Called with maxSize < 0");
        local_20 = -1;
      }
      else {
        local_20 = QIODevicePrivate::read(this_00,__fd,__buf,0);
      }
    }
    else {
      do {
        iVar4 = QIODevicePrivate::QRingBufferRef::getChar
                          ((QRingBufferRef *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        if (iVar4 == -1) goto LAB_00130978;
        if (!bVar1) {
          this_00->pos = this_00->pos + 1;
        }
        uVar5 = in_stack_ffffffffffffff84 & 0xffffff;
        if ((char)iVar4 == '\r') {
          local_14.super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i =
               (QFlagsStorage<QIODeviceBase::OpenModeFlag>)
               QFlags<QIODeviceBase::OpenModeFlag>::operator&
                         ((QFlags<QIODeviceBase::OpenModeFlag> *)
                          (CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) &
                          0xffffffffffffff),(OpenModeFlag)((ulong)in_stack_ffffffffffffff78 >> 0x20)
                         );
          bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
          uVar5 = CONCAT13(bVar2,(int3)uVar5);
        }
        in_stack_ffffffffffffff84 = uVar5;
      } while ((char)(uVar5 >> 0x18) != '\0');
      *(char *)CONCAT44(in_register_00000034,__fd) = (char)iVar4;
      bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty
                        ((QRingBufferRef *)CONCAT44(uVar5,in_stack_ffffffffffffff80));
      if (bVar1) {
        (*this->_vptr_QIODevice[0xf])(this,(char *)CONCAT44(in_register_00000034,__fd),0);
      }
      local_20 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

qint64 QIODevice::read(char *data, qint64 maxSize)
{
    Q_D(QIODevice);
#if defined QIODEVICE_DEBUG
    printf("%p QIODevice::read(%p, %lld), d->pos = %lld, d->buffer.size() = %lld\n",
           this, data, maxSize, d->pos, d->buffer.size());
#endif

    CHECK_READABLE(read, qint64(-1));
    const bool sequential = d->isSequential();

    // Short-cut for getChar(), unless we need to keep the data in the buffer.
    if (maxSize == 1 && !(sequential && d->transactionStarted)) {
        int chint;
        while ((chint = d->buffer.getChar()) != -1) {
            if (!sequential)
                ++d->pos;

            char c = char(uchar(chint));
            if (c == '\r' && (d->openMode & Text))
                continue;
            *data = c;
#if defined QIODEVICE_DEBUG
            printf("%p \tread 0x%hhx (%c) returning 1 (shortcut)\n", this,
                   int(c), isAsciiPrintable(c) ? c : '?');
#endif
            if (d->buffer.isEmpty())
                readData(data, 0);
            return qint64(1);
        }
    }

    CHECK_MAXLEN(read, qint64(-1));
    const qint64 readBytes = d->read(data, maxSize);

#if defined QIODEVICE_DEBUG
    printf("%p \treturning %lld, d->pos == %lld, d->buffer.size() == %lld\n", this,
           readBytes, d->pos, d->buffer.size());
    if (readBytes > 0)
        debugBinaryString(data - readBytes, readBytes);
#endif

    return readBytes;
}